

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

void dumpInfo(DataFieldInfo *info,Bounds iBounds,Bounds jBounds,Bounds kBounds,Bounds lBounds)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  Bounds local_50;
  Bounds local_48;
  Bounds local_40;
  Bounds local_38;
  
  iVar1 = info->iSize_ + -1;
  local_38.upper = iBounds.upper;
  if (local_38.upper <= iVar1) {
    iVar1 = local_38.upper;
  }
  local_38.lower = iBounds.lower;
  local_38.upper = iVar1;
  iVar1 = info->jSize_ + -1;
  local_40.upper = jBounds.upper;
  if (local_40.upper <= iVar1) {
    iVar1 = local_40.upper;
  }
  local_40.lower = jBounds.lower;
  local_40.upper = iVar1;
  iVar1 = info->kSize_ + -1;
  local_48.upper = kBounds.upper;
  if (local_48.upper <= iVar1) {
    iVar1 = local_48.upper;
  }
  local_48.lower = kBounds.lower;
  local_48.upper = iVar1;
  iVar1 = info->lSize_ + -1;
  local_50.upper = lBounds.upper;
  if (local_50.upper <= iVar1) {
    iVar1 = local_50.upper;
  }
  local_50.lower = lBounds.lower;
  local_50.upper = iVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Field: ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(info->name_)._M_dataplus._M_p,
                      (info->name_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(info->type_)._M_dataplus._M_p,
                      (info->type_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rank: ",6);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,info->rank_);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bytes per Element: ",0x13);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,info->bytesPerElement_);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iSize: ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info->iSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  operator<<(poVar2,&local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"jSize: ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info->jSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  operator<<(poVar2,&local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"kSize: ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info->kSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  operator<<(poVar2,&local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lSize: ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info->lSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  operator<<(poVar2,&local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void dumpInfo(const DataFieldInfo& info, Bounds iBounds, Bounds jBounds, Bounds kBounds, Bounds lBounds)
{
	iBounds.upper = std::min(iBounds.upper, info.iSize() - 1);
	jBounds.upper = std::min(jBounds.upper, info.jSize() - 1);
	kBounds.upper = std::min(kBounds.upper, info.kSize() - 1);
	lBounds.upper = std::min(lBounds.upper, info.lSize() - 1);

	std::cout << "Field: " << info.name() << std::endl;
	std::cout << "Type: " << info.type() << std::endl;
	std::cout << "Rank: " << info.rank() << std::endl;
	std::cout << "Bytes per Element: " << info.bytesPerElement() << std::endl;
	std::cout << "iSize: " << info.iSize() << " " << iBounds << std::endl;
	std::cout << "jSize: " << info.jSize() << " " << jBounds << std::endl;
	std::cout << "kSize: " << info.kSize() << " " << kBounds << std::endl;
	std::cout << "lSize: " << info.lSize() << " " << lBounds << std::endl;
}